

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix3x3.cpp
# Opt level: O0

Matrix3x3 * __thiscall CMU462::Matrix3x3::T(Matrix3x3 *this)

{
  double *pdVar1;
  Matrix3x3 *in_RDI;
  int j;
  int i;
  Matrix3x3 *A;
  Matrix3x3 *B;
  double in_stack_ffffffffffffffc8;
  Matrix3x3 *this_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  this_00 = in_RDI;
  Matrix3x3((Matrix3x3 *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (iVar3 = 0; iVar3 < 3; iVar3 = iVar3 + 1) {
    for (iVar2 = 0; iVar2 < 3; iVar2 = iVar2 + 1) {
      pdVar1 = operator()(this_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffc8,0));
      in_stack_ffffffffffffffc8 = *pdVar1;
      pdVar1 = operator()(this_00,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                          SUB84(in_stack_ffffffffffffffc8,0));
      *pdVar1 = in_stack_ffffffffffffffc8;
    }
  }
  return in_RDI;
}

Assistant:

Matrix3x3 Matrix3x3::T( void ) const {
    const Matrix3x3& A( *this );
    Matrix3x3 B;

    for( int i = 0; i < 3; i++ )
    for( int j = 0; j < 3; j++ )
    {
       B(i,j) = A(j,i);
    }

    return B;
  }